

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

void __thiscall r_exec::InputLessPGMOverlay::patch_tpl_args(InputLessPGMOverlay *this)

{
  Atom *pAVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t pgm_code_index;
  uint16_t ipgm_code_index;
  Code *pCVar4;
  Atom local_24 [4];
  Atom *local_20;
  Atom *skel_iptr;
  uint16_t i;
  uint16_t ipgm_arg_set_index;
  uint16_t arg_count;
  uint16_t tpl_arg_set_index;
  InputLessPGMOverlay *this_local;
  
  _i = this;
  skel_iptr._6_2_ = r_code::Atom::asIndex();
  bVar2 = r_code::Atom::getAtomCount();
  skel_iptr._4_2_ = (ushort)bVar2;
  pCVar4 = Overlay::getObject(&this->super_Overlay);
  (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,2);
  skel_iptr._2_2_ = r_code::Atom::asIndex();
  for (skel_iptr._0_2_ = 1; (ushort)skel_iptr <= skel_iptr._4_2_;
      skel_iptr._0_2_ = (ushort)skel_iptr + 1) {
    pAVar1 = (this->super_Overlay).code;
    uVar3 = r_code::Atom::asIndex();
    local_20 = pAVar1 + (ulong)uVar3 * 4 + 4;
    pgm_code_index = r_code::Atom::asIndex();
    pCVar4 = Overlay::getObject(&this->super_Overlay);
    (*(pCVar4->super__Object)._vptr__Object[4])
              (pCVar4,(ulong)(ushort)(skel_iptr._2_2_ + (ushort)skel_iptr));
    ipgm_code_index = r_code::Atom::asIndex();
    patch_tpl_code(this,pgm_code_index,ipgm_code_index);
    r_code::Atom::IPGMPointer((ushort)local_24);
    r_code::Atom::operator=(local_20,local_24);
    r_code::Atom::~Atom(local_24);
  }
  return;
}

Assistant:

void InputLessPGMOverlay::patch_tpl_args()   // no rollback on that part of the code.
{
    //getObject()->trace();
    uint16_t tpl_arg_set_index = code[PGM_TPL_ARGS].asIndex(); // index to the set of all tpl patterns.
    uint16_t arg_count = code[tpl_arg_set_index].getAtomCount();
    uint16_t ipgm_arg_set_index = getObject()->code(IPGM_ARGS).asIndex(); // index to the set of all ipgm tpl args.

    for (uint16_t i = 1; i <= arg_count; ++i) { // pgm_code[tpl_arg_set_index+i] is an iptr to a pattern.
        Atom &skel_iptr = code[code[tpl_arg_set_index + i].asIndex() + 1];
        patch_tpl_code(skel_iptr.asIndex(), getObject()->code(ipgm_arg_set_index + i).asIndex());
        skel_iptr = Atom::IPGMPointer(ipgm_arg_set_index + i); // patch the pgm code with ptrs to the tpl args' actual location in the ipgm code.
    }

    //Atom::Trace(pgm_code,getObject()->get_reference(0)->code_size());
}